

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PtexCache.cpp
# Opt level: O2

void __thiscall
Ptex::v2_2::PtexReaderCache::Purger::operator()(Purger *this,PtexCachedReader *reader)

{
  bool bVar1;
  size_t memUsedChange;
  size_t local_10;
  
  bVar1 = PtexCachedReader::tryPurge(reader,&local_10);
  if (bVar1) {
    this->memUsedChangeTotal = this->memUsedChangeTotal + local_10;
  }
  return;
}

Assistant:

void PtexReaderCache::Purger::operator()(PtexCachedReader* reader)
{
    size_t memUsedChange;
    if (reader->tryPurge(memUsedChange)) {
        memUsedChangeTotal += memUsedChange;
    }
}